

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

double ImGui::RoundScalarWithFormatT<double,double>(char *format,ImGuiDataType data_type,double v)

{
  char *fmt;
  char **local_a0;
  char *p;
  char v_str [64];
  char fmt_sanitized [32];
  char *fmt_start;
  double v_local;
  char *pcStack_18;
  ImGuiDataType data_type_local;
  char *format_local;
  
  fmt_start = (char *)v;
  v_local._4_4_ = data_type;
  pcStack_18 = format;
  fmt = ImParseFormatFindStart(format);
  if ((*fmt == '%') && (fmt[1] != '%')) {
    SanitizeFormatString(fmt,v_str + 0x38,0x20);
    ImFormatString((char *)&p,0x40,v_str + 0x38,fmt_start);
    for (local_a0 = &p; *(char *)local_a0 == ' '; local_a0 = (char **)((long)local_a0 + 1)) {
    }
    if ((v_local._4_4_ == 8) || (v_local._4_4_ == 9)) {
      fmt_start = (char *)atof((char *)local_a0);
    }
    else {
      ImAtoi<double>((char *)local_a0,(double *)&fmt_start);
    }
    format_local = fmt_start;
  }
  else {
    format_local = fmt_start;
  }
  return (double)format_local;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}